

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

SurfaceVertexVectorQuantity * __thiscall
polyscope::SurfaceMesh::addVertexVectorQuantityImpl
          (SurfaceMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors,VectorType vectorType)

{
  SurfaceVertexVectorQuantity *this_00;
  string *in_RSI;
  bool in_stack_00000057;
  QuantityType *in_stack_00000058;
  QuantityStructure<polyscope::SurfaceMesh> *in_stack_00000060;
  SurfaceVertexVectorQuantity *q;
  VectorType in_stack_ffffffffffffffb4;
  SurfaceMesh *in_stack_ffffffffffffffb8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  SurfaceVertexVectorQuantity *in_stack_ffffffffffffffd0;
  
  this_00 = (SurfaceVertexVectorQuantity *)operator_new(0xd0);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,in_RSI);
  applyPermutation<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_ffffffffffffffc8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffc0);
  SurfaceVertexVectorQuantity::SurfaceVertexVectorQuantity
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  QuantityStructure<polyscope::SurfaceMesh>::addQuantity
            (in_stack_00000060,in_stack_00000058,in_stack_00000057);
  return this_00;
}

Assistant:

SurfaceVertexVectorQuantity* SurfaceMesh::addVertexVectorQuantityImpl(std::string name,
                                                                      const std::vector<glm::vec3>& vectors,
                                                                      VectorType vectorType) {
  SurfaceVertexVectorQuantity* q =
      new SurfaceVertexVectorQuantity(name, applyPermutation(vectors, vertexPerm), *this, vectorType);
  addQuantity(q);
  return q;
}